

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_modinv64_uint16(uint16_t *out,uint16_t *in,uint16_t *mod)

{
  ulong *puVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint64_t uVar14;
  long lVar15;
  byte bVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  code *pcVar20;
  ulong uVar21;
  secp256k1_modinv64_modinfo *modinfo;
  ulong uVar22;
  ulong uVar23;
  secp256k1_modinv64_signed62 *psVar24;
  secp256k1_modinv64_signed62 *psVar25;
  uint16_t *out_00;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  int iVar29;
  undefined8 uVar30;
  int iVar31;
  secp256k1_modinv64_signed62 x;
  secp256k1_modinv64_modinfo m;
  uint16_t tmp [16];
  uint16_t negone [16];
  int iStack_19c;
  secp256k1_modinv32_trans2x2 sStack_190;
  undefined8 uStack_180;
  secp256k1_modinv32_signed30 sStack_178;
  int iStack_14c;
  secp256k1_modinv32_signed30 sStack_148;
  code *pcStack_120;
  ulong uStack_118;
  undefined8 uStack_110;
  uint16_t *puStack_108;
  uint16_t *puStack_100;
  code *pcStack_f8;
  code *pcStack_f0;
  secp256k1_modinv64_signed62 local_e8;
  uint local_bc;
  secp256k1_modinv64_modinfo local_b8;
  uint16_t local_88 [20];
  uint16_t *local_60;
  uint16_t local_58;
  undefined8 local_56;
  undefined6 uStack_4e;
  undefined2 uStack_48;
  undefined6 uStack_46;
  undefined8 uStack_40;
  
  psVar24 = &local_e8;
  psVar25 = &local_e8;
  local_e8.v[0] = 0;
  local_e8.v[1] = 0;
  local_e8.v[2] = 0;
  local_e8.v[3] = 0;
  local_e8.v[4] = 0;
  uVar21 = 0;
  do {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar21 >> 1;
    puVar1 = (ulong *)((long)local_e8.v +
                      (ulong)((uint)((uVar21 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) & 0xfffffff8))
    ;
    *puVar1 = *puVar1 | (ulong)((in[uVar21 >> 4 & 0xfffffff] >> ((uint)uVar21 & 0xf) & 1) != 0) <<
                        ((char)(SUB164(auVar3 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)uVar21 & 0x3fU);
    uVar21 = uVar21 + 1;
  } while ((int)uVar21 != 0x100);
  uVar21 = local_e8.v[1] | local_e8.v[0] | local_e8.v[2] | local_e8.v[3] | local_e8.v[4];
  local_b8.modulus.v[0] = 0;
  local_b8.modulus.v[1] = 0;
  local_b8.modulus.v[2] = 0;
  local_b8.modulus.v[3] = 0;
  local_b8.modulus.v[4] = 0;
  modinfo = (secp256k1_modinv64_modinfo *)0x0;
  do {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (ulong)modinfo >> 1;
    puVar1 = (ulong *)((long)local_b8.modulus.v +
                      (ulong)((uint)(((ulong)modinfo >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) &
                             0xfffffff8));
    *puVar1 = *puVar1 | (ulong)((mod[(ulong)modinfo >> 4 & 0xfffffff] >> ((uint)modinfo & 0xf) & 1)
                               != 0) <<
                        ((char)(SUB164(auVar4 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)modinfo & 0x3fU);
    modinfo = (secp256k1_modinv64_modinfo *)((long)(modinfo->modulus).v + 1);
  } while ((int)modinfo != 0x100);
  uVar30 = 0x3fffffffffffffff;
  pcStack_f0 = (code *)0x16189b;
  out_00 = (uint16_t *)local_b8.modulus.v[0];
  uVar14 = modinv2p64(local_b8.modulus.v[0]);
  local_b8.modulus_inv62 = uVar14 & 0x3fffffffffffffff;
  if ((uVar14 * local_b8.modulus.v[0] & 0x3fffffffffffffff) != 1) goto LAB_00161cca;
  if (uVar21 == 0) {
LAB_00161a1d:
    local_60 = mod;
    local_e8.v[2] = 0;
    local_e8.v[3] = 0;
    local_e8.v[0] = 0;
    local_e8.v[1] = 0;
    local_e8.v[4] = 0;
    uVar22 = 0;
    do {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar22 >> 1;
      puVar1 = (ulong *)((long)local_e8.v +
                        (ulong)((uint)((uVar22 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) & 0xfffffff8
                               ));
      *puVar1 = *puVar1 | (ulong)((in[uVar22 >> 4 & 0xfffffff] >> ((uint)uVar22 & 0xf) & 1) != 0) <<
                          ((char)(SUB164(auVar7 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                           (char)uVar22 & 0x3fU);
      uVar22 = uVar22 + 1;
    } while ((int)uVar22 != 0x100);
    iVar12 = 8;
    do {
      uVar22 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
               secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0]
               >> 0x3e;
      lVar15 = local_b8.modulus.v[uVar22];
      if ((lVar15 < 1) || (lVar19 = local_b8.modulus.v[uVar22 + 1], 0x3fffffffffffffff < lVar19)) {
        if ((lVar15 < 0) && (lVar19 = local_b8.modulus.v[uVar22 + 1], -0x4000000000000000 < lVar19))
        {
          local_b8.modulus.v[uVar22] = lVar15 + 0x4000000000000000;
          lVar19 = lVar19 + -1;
          goto LAB_00161b10;
        }
      }
      else {
        local_b8.modulus.v[uVar22] = lVar15 + -0x4000000000000000;
        lVar19 = lVar19 + 1;
LAB_00161b10:
        local_b8.modulus.v[uVar22 + 1] = lVar19;
      }
      uVar28 = secp256k1_test_state[1] << 0x11;
      uVar23 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar22 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar23;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar22;
      secp256k1_test_state[2] = uVar23 ^ uVar28;
      secp256k1_test_state[3] = uVar22 << 0x2d | uVar22 >> 0x13;
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
    local_bc = (uint)(uVar21 != 0);
    uVar21 = 0;
    uVar30 = 0x84210843;
    while( true ) {
      iVar12 = (int)uVar21;
      pcVar20 = secp256k1_modinv64_var;
      if (iVar12 == 0) {
        pcVar20 = secp256k1_modinv64;
      }
      pcStack_f0 = (code *)0x161b85;
      (*pcVar20)(&local_e8);
      out[8] = 0;
      out[9] = 0;
      out[10] = 0;
      out[0xb] = 0;
      out[0xc] = 0;
      out[0xd] = 0;
      out[0xe] = 0;
      out[0xf] = 0;
      out[0] = 0;
      out[1] = 0;
      out[2] = 0;
      out[3] = 0;
      out[4] = 0;
      out[5] = 0;
      out[6] = 0;
      out[7] = 0;
      uVar22 = 0;
      do {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = uVar22 >> 1;
        out[uVar22 >> 4 & 0xfffffff] =
             out[uVar22 >> 4 & 0xfffffff] |
             (ushort)((*(ulong *)((long)local_e8.v +
                                 (ulong)((uint)((uVar22 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) &
                                        0xfffffff8)) >>
                       ((ulong)((SUB164(auVar8 * ZEXT816(0x8421084210842109),8) >> 4) * 2 +
                               (int)uVar22) & 0x3f) & 1) != 0) << ((byte)uVar22 & 0xf);
        uVar22 = uVar22 + 1;
      } while ((int)uVar22 != 0x100);
      out_00 = local_88;
      pcStack_f0 = (code *)0x161bf5;
      modinfo = (secp256k1_modinv64_modinfo *)out;
      mulmod256(out_00,out,in,local_60);
      if (local_88[0] != (uint16_t)local_bc) break;
      lVar15 = 1;
      do {
        if (local_88[lVar15] != 0) {
          pcStack_f0 = (code *)0x161cc0;
          test_modinv64_uint16_cold_4();
          goto LAB_00161cc0;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != 0x10);
      pcStack_f0 = (code *)0x161c28;
      (*pcVar20)(&local_e8);
      local_88[8] = 0;
      local_88[9] = 0;
      local_88[10] = 0;
      local_88[0xb] = 0;
      local_88[0xc] = 0;
      local_88[0xd] = 0;
      local_88[0xe] = 0;
      local_88[0xf] = 0;
      local_88[0] = 0;
      local_88[1] = 0;
      local_88[2] = 0;
      local_88[3] = 0;
      local_88[4] = 0;
      local_88[5] = 0;
      local_88[6] = 0;
      local_88[7] = 0;
      modinfo = (secp256k1_modinv64_modinfo *)0x0;
      do {
        auVar9._8_8_ = 0;
        auVar9._0_8_ = (ulong)modinfo >> 1;
        out_00 = (uint16_t *)
                 ((ulong)((*(ulong *)((long)local_e8.v +
                                     (ulong)((uint)(((ulong)modinfo >> 1 & 0x7fffffff) * 0x84210843
                                                   >> 0x21) & 0xfffffff8)) >>
                           ((ulong)((SUB164(auVar9 * ZEXT816(0x8421084210842109),8) >> 4) * 2 +
                                   (int)modinfo) & 0x3f) & 1) != 0) << ((byte)modinfo & 0xf));
        local_88[(ulong)modinfo >> 4 & 0xfffffff] =
             local_88[(ulong)modinfo >> 4 & 0xfffffff] | (ushort)out_00;
        modinfo = (secp256k1_modinv64_modinfo *)((long)(modinfo->modulus).v + 1);
      } while ((int)modinfo != 0x100);
      lVar15 = 0;
      do {
        if (local_88[lVar15] != in[lVar15]) goto LAB_00161cc0;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 0x10);
      uVar21 = (ulong)(iVar12 + 1);
      if (iVar12 != 0) {
        return;
      }
    }
    goto LAB_00161cc5;
  }
  pcStack_f0 = (code *)0x1618d5;
  mulmod256(local_88,in,in,mod);
  local_e8.v[2] = 0;
  local_e8.v[3] = 0;
  local_e8.v[0] = 0;
  local_e8.v[1] = 0;
  local_e8.v[4] = 0;
  uVar22 = 0;
  do {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar22 >> 1;
    puVar1 = (ulong *)((long)local_e8.v +
                      (ulong)((uint)((uVar22 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) & 0xfffffff8))
    ;
    *puVar1 = *puVar1 | (ulong)((local_88[uVar22 >> 4 & 0xfffffff] >> ((uint)uVar22 & 0xf) & 1) != 0
                               ) <<
                        ((char)(SUB164(auVar5 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)uVar22 & 0x3fU);
    uVar22 = uVar22 + 1;
  } while ((int)uVar22 != 0x100);
  modinfo = &local_b8;
  pcStack_f0 = (code *)0x161950;
  uVar11 = secp256k1_jacobi64_maybe_var(&local_e8,modinfo);
  if (uVar11 < 2) {
    local_58 = *mod - 1;
    local_56 = *(undefined8 *)(mod + 1);
    uStack_40 = *(undefined8 *)(mod + 0xc);
    uStack_4e = (undefined6)*(undefined8 *)(mod + 5);
    uStack_48 = (undefined2)*(undefined8 *)(mod + 8);
    uStack_46 = (undefined6)((ulong)*(undefined8 *)(mod + 8) >> 0x10);
    pcStack_f0 = (code *)0x161989;
    mulmod256(local_88,local_88,&local_58,mod);
    local_e8.v[2] = 0;
    local_e8.v[3] = 0;
    local_e8.v[0] = 0;
    local_e8.v[1] = 0;
    local_e8.v[4] = 0;
    uVar22 = 0;
    do {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar22 >> 1;
      puVar1 = (ulong *)((long)local_e8.v +
                        (ulong)((uint)((uVar22 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) & 0xfffffff8
                               ));
      *puVar1 = *puVar1 | (ulong)((local_88[uVar22 >> 4 & 0xfffffff] >> ((uint)uVar22 & 0xf) & 1) !=
                                 0) <<
                          ((char)(SUB164(auVar6 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                           (char)uVar22 & 0x3fU);
      uVar22 = uVar22 + 1;
    } while ((int)uVar22 != 0x100);
    modinfo = &local_b8;
    pcStack_f0 = (code *)0x161a04;
    iVar12 = secp256k1_jacobi64_maybe_var(&local_e8,modinfo);
    if ((iVar12 != 0) && (iVar12 != 1 - (*mod & 2))) goto LAB_00161cd4;
    goto LAB_00161a1d;
  }
LAB_00161ccf:
  psVar25 = psVar24;
  pcStack_f0 = (code *)0x161cd4;
  test_modinv64_uint16_cold_6();
LAB_00161cd4:
  pcStack_f0 = modinv2p64;
  test_modinv64_uint16_cold_2();
  if (((ulong)psVar25 & 1) != 0) {
    iVar12 = 6;
    do {
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
    return;
  }
  pcStack_f8 = secp256k1_jacobi32_maybe_var;
  modinv2p64_cold_1();
  pcStack_f8 = (code *)0x8421084210842109;
  puStack_100 = out;
  puStack_108 = in;
  uStack_110 = uVar30;
  uStack_118 = uVar21;
  pcStack_120 = (code *)mod;
  sStack_178.v[8] = (int32_t)(modinfo->modulus).v[4];
  sStack_178.v._16_8_ = (modinfo->modulus).v[2];
  sStack_178.v._24_8_ = (modinfo->modulus).v[3];
  sStack_178.v._0_8_ = (modinfo->modulus).v[0];
  sStack_178.v._8_8_ = (modinfo->modulus).v[1];
  sStack_148.v[8] = *(int32_t *)((long)psVar25 + 0x20);
  sStack_148.v._0_8_ = psVar25->v[0];
  sStack_148.v._8_8_ = *(undefined8 *)((long)psVar25 + 8);
  sStack_148.v._16_8_ = *(undefined8 *)((long)psVar25 + 0x10);
  sStack_148.v._24_8_ = *(undefined8 *)((long)psVar25 + 0x18);
  uVar21 = 9;
  iVar29 = -1;
  iVar12 = 0;
  do {
    iVar18 = 0;
    if ((sStack_148.v[0] | 0xc0000000U) != 0) {
      for (; ((sStack_148.v[0] | 0xc0000000U) >> iVar18 & 1) == 0; iVar18 = iVar18 + 1) {
      }
    }
    sStack_190.u = 1 << ((byte)iVar18 & 0x1f);
    iVar29 = iVar29 - iVar18;
    if (iVar18 == 0x1e) {
      iStack_19c = 1;
      sStack_190.q = 0;
      sStack_190.v = 0;
    }
    else {
      uVar11 = sStack_178.v[1] << 0x1e | sStack_178.v[0];
      uVar17 = (uint)(sStack_148.v[1] << 0x1e | sStack_148.v[0]) >> ((byte)iVar18 & 0x1f);
      iVar18 = 0x1e - iVar18;
      iStack_19c = 1;
      sStack_190.v = 0;
      sStack_190.q = 0;
      do {
        iVar31 = sStack_190.u;
        uVar26 = uVar17;
        iVar27 = sStack_190.v;
        if (iVar29 < 0) {
          iVar29 = -iVar29;
          iVar31 = sStack_190.q;
          uVar26 = uVar11;
          uVar11 = uVar17;
          sStack_190.q = sStack_190.u;
          iVar27 = iStack_19c;
          iStack_19c = sStack_190.v;
        }
        iVar2 = iVar29 + 1;
        if (iVar18 <= iVar29 + 1) {
          iVar2 = iVar18;
        }
        uVar13 = ((uint)(byte)(secp256k1_modinv32_inv256[uVar11 >> 1 & 0x7f] * (char)uVar26) <<
                 (-(char)iVar2 & 0x1fU)) >> (-(char)iVar2 & 0x1fU);
        uVar26 = uVar13 * uVar11 + uVar26;
        sStack_190.q = uVar13 * iVar31 + sStack_190.q;
        uVar17 = -1 << ((byte)iVar18 & 0x1f) | uVar26;
        iVar2 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> iVar2 & 1) == 0; iVar2 = iVar2 + 1) {
          }
        }
        bVar16 = (byte)iVar2;
        uVar17 = uVar26 >> (bVar16 & 0x1f);
        sStack_190.u = iVar31 << (bVar16 & 0x1f);
        sStack_190.v = iVar27 << (bVar16 & 0x1f);
        iStack_19c = uVar13 * iVar27 + iStack_19c;
        iVar29 = iVar29 - iVar2;
        iVar18 = iVar18 - iVar2;
      } while (iVar18 != 0);
    }
    uVar11 = (uint)uVar21;
    sStack_190.r = iStack_19c;
    uStack_180 = uVar21;
    secp256k1_modinv32_update_fg_30_var(uVar11,&sStack_178,&sStack_148,&sStack_190);
    if (sStack_178.v[0] == 1) {
      if (1 < (int)uVar11) {
        uVar17 = 0;
        uVar22 = 1;
        do {
          uVar17 = uVar17 | sStack_178.v[uVar22];
          uVar22 = uVar22 + 1;
        } while (uVar21 != uVar22);
        if (uVar17 != 0) goto LAB_00161ee9;
      }
      bVar10 = false;
    }
    else {
LAB_00161ee9:
      uVar17 = uVar11 - 1;
      if (((int)(uVar11 - 2) < 0 || *(int *)((long)&uStack_180 + (long)(int)uVar11 * 4 + 4) != 0) ||
          (&iStack_14c)[(int)uVar11] != 0) {
        uVar17 = uVar11;
      }
      bVar10 = true;
      uVar21 = (ulong)uVar17;
    }
    if ((!bVar10) || (iVar12 = iVar12 + 1, iVar12 == 0x32)) {
      return;
    }
  } while( true );
LAB_00161cc0:
  pcStack_f0 = (code *)0x161cc5;
  test_modinv64_uint16_cold_5();
LAB_00161cc5:
  pcStack_f0 = (code *)0x161cca;
  test_modinv64_uint16_cold_3();
  mod = (uint16_t *)pcVar20;
LAB_00161cca:
  pcStack_f0 = (code *)0x161ccf;
  test_modinv64_uint16_cold_1();
  psVar24 = (secp256k1_modinv64_signed62 *)out_00;
  goto LAB_00161ccf;
}

Assistant:

static void test_modinv64_uint16(uint16_t* out, const uint16_t* in, const uint16_t* mod) {
    static const int64_t M62 = (int64_t)(UINT64_MAX >> 2);
    uint16_t tmp[16];
    secp256k1_modinv64_signed62 x;
    secp256k1_modinv64_modinfo m;
    int i, vartime, nonzero;

    uint16_to_signed62(&x, in);
    nonzero = (x.v[0] | x.v[1] | x.v[2] | x.v[3] | x.v[4]) != 0;
    uint16_to_signed62(&m.modulus, mod);

    /* compute 1/modulus mod 2^62 */
    m.modulus_inv62 = modinv2p64(m.modulus.v[0]) & M62;
    CHECK(((m.modulus_inv62 * m.modulus.v[0]) & M62) == 1);

    /* Test secp256k1_jacobi64_maybe_var. */
    if (nonzero) {
        int jac;
        uint16_t sqr[16], negone[16];
        mulmod256(sqr, in, in, mod);
        uint16_to_signed62(&x, sqr);
        /* Compute jacobi symbol of in^2, which must be 1 (or uncomputable). */
        jac = secp256k1_jacobi64_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1);
        /* Then compute the jacobi symbol of -(in^2). x and -x have opposite
         * jacobi symbols if and only if (mod % 4) == 3. */
        negone[0] = mod[0] - 1;
        for (i = 1; i < 16; ++i) negone[i] = mod[i];
        mulmod256(sqr, sqr, negone, mod);
        uint16_to_signed62(&x, sqr);
        jac = secp256k1_jacobi64_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1 - (mod[0] & 2));
    }

    uint16_to_signed62(&x, in);
    mutate_sign_signed62(&m.modulus);
    for (vartime = 0; vartime < 2; ++vartime) {
        /* compute inverse */
        (vartime ? secp256k1_modinv64_var : secp256k1_modinv64)(&x, &m);

        /* produce output */
        signed62_to_uint16(out, &x);

        /* check if the inverse times the input is 1 (mod m), unless x is 0. */
        mulmod256(tmp, out, in, mod);
        CHECK(tmp[0] == nonzero);
        for (i = 1; i < 16; ++i) CHECK(tmp[i] == 0);

        /* invert again */
        (vartime ? secp256k1_modinv64_var : secp256k1_modinv64)(&x, &m);

        /* check if the result is equal to the input */
        signed62_to_uint16(tmp, &x);
        for (i = 0; i < 16; ++i) CHECK(tmp[i] == in[i]);
    }
}